

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

string * __thiscall
inja::Parser::parse_filename_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  ulong uVar1;
  char *pcVar2;
  long *plVar3;
  ParserError *pPVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  SourceLocation SVar8;
  string local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  string local_48;
  
  if ((this->tok).kind != String) {
    Token::describe_abi_cxx11_(&local_48,&this->tok);
    plVar3 = (long *)::std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x141c62);
    local_68 = (long *)*plVar3;
    plVar5 = plVar3 + 2;
    if (local_68 == plVar5) {
      local_58 = *plVar5;
      lStack_50 = plVar3[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar5;
    }
    local_60 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::append((char *)&local_68);
    local_88._M_dataplus._M_p = (pointer)*plVar3;
    psVar6 = (size_type *)(plVar3 + 2);
    if ((size_type *)local_88._M_dataplus._M_p == psVar6) {
      local_88.field_2._M_allocated_capacity = *psVar6;
      local_88.field_2._8_4_ = (undefined4)plVar3[3];
      local_88.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar6;
    }
    local_88._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    pPVar4 = (ParserError *)__cxa_allocate_exception(0x60);
    SVar8 = Lexer::current_position(&this->lexer);
    ParserError::ParserError(pPVar4,&local_88,SVar8);
    __cxa_throw(pPVar4,&ParserError::typeinfo,InjaError::~InjaError);
  }
  uVar1 = (this->tok).text._M_len;
  if (1 < uVar1) {
    uVar7 = uVar1 - 1;
    if (uVar1 - 2 <= uVar1 - 1) {
      uVar7 = uVar1 - 2;
    }
    pcVar2 = (this->tok).text._M_str;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar2 + 1,pcVar2 + uVar7 + 1);
    return __return_storage_ptr__;
  }
  pcVar2 = (this->tok).text._M_str;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,pcVar2,pcVar2 + uVar1);
  plVar3 = (long *)::std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x141c79);
  local_68 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_68 == plVar5) {
    local_58 = *plVar5;
    lStack_50 = plVar3[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar5;
  }
  local_60 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_68);
  local_88._M_dataplus._M_p = (pointer)*plVar3;
  psVar6 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_88._M_dataplus._M_p == psVar6) {
    local_88.field_2._M_allocated_capacity = *psVar6;
    local_88.field_2._8_4_ = (undefined4)plVar3[3];
    local_88.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar6;
  }
  local_88._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  pPVar4 = (ParserError *)__cxa_allocate_exception(0x60);
  SVar8 = Lexer::current_position(&this->lexer);
  ParserError::ParserError(pPVar4,&local_88,SVar8);
  __cxa_throw(pPVar4,&ParserError::typeinfo,InjaError::~InjaError);
}

Assistant:

std::string parse_filename() const {
    if (tok.kind != Token::Kind::String) {
      throw_parser_error("expected string, got '" + tok.describe() + "'");
    }

    if (tok.text.length() < 2) {
      throw_parser_error("expected filename, got '" + static_cast<std::string>(tok.text) + "'");
    }

    // Remove first and last character ""
    return std::string {tok.text.substr(1, tok.text.length() - 2)};
  }